

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O1

void __thiscall
QPDFWriter::activatePipelineStack
          (QPDFWriter *this,PipelinePopper *pp,bool discard,string *str,
          unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *link)

{
  unsigned_long *puVar1;
  element_type *peVar2;
  unsigned_long uVar3;
  Pipeline *next;
  Count *pCVar4;
  _Head_base<0UL,_Pipeline_*,_false> next_00;
  _Head_base<0UL,_qpdf::pl::Link_*,_false> *this_00;
  Count *c;
  Count *local_48;
  _Head_base<0UL,_qpdf::pl::Link_*,_false> local_40;
  _Head_base<0UL,_qpdf::pl::Link_*,_false> local_38;
  
  if ((link->_M_t).super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
      super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
      super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl == (Link *)0x0) {
    if (discard) {
      pCVar4 = (Count *)operator_new(0x58);
      uVar3 = ((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->next_stack_id;
      Pipeline::Pipeline((Pipeline *)pCVar4,"",(Pipeline *)0x0);
      (pCVar4->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Count_002f6298;
      pCVar4->count = 0;
      pCVar4->str = (string *)0x0;
      (pCVar4->link)._M_t.
      super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
      super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
      super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl = (Link *)0x0;
      pCVar4->id_ = uVar3;
      pCVar4->pass_immediately_to_next = false;
      local_48 = pCVar4;
      goto LAB_001ecf6f;
    }
    pCVar4 = (Count *)operator_new(0x58);
    peVar2 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar3 = peVar2->next_stack_id;
    if (str == (string *)0x0) {
      next = (*(pointer *)
               ((long)&(peVar2->pipeline_stack).
                       super__Vector_base<Pipeline_*,_std::allocator<Pipeline_*>_>._M_impl.
                       super__Vector_impl_data + 8))[-1];
      Pipeline::Pipeline((Pipeline *)pCVar4,"",next);
      (pCVar4->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Count_002f6298;
      pCVar4->count = 0;
      pCVar4->str = (string *)0x0;
      (pCVar4->link)._M_t.
      super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
      super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
      super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl = (Link *)0x0;
      pCVar4->id_ = uVar3;
      pCVar4->pass_immediately_to_next = next != (Pipeline *)0x0;
      local_48 = pCVar4;
      goto LAB_001ecf6f;
    }
    local_40._M_head_impl = (Link *)0x0;
    Pipeline::Pipeline((Pipeline *)pCVar4,"",(Pipeline *)0x0);
    (pCVar4->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Count_002f6298;
    pCVar4->count = 0;
    pCVar4->str = str;
    this_00 = &local_40;
    (pCVar4->link)._M_t.super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>.
    _M_t.super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
    super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl = local_40._M_head_impl;
    local_40._M_head_impl = (Link *)0x0;
    pCVar4->id_ = uVar3;
  }
  else {
    pCVar4 = (Count *)operator_new(0x58);
    peVar2 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar3 = peVar2->next_stack_id;
    local_38._M_head_impl =
         (link->_M_t).super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>.
         _M_t.super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
         super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl;
    (link->_M_t).super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
    super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
    super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl = (Link *)0x0;
    if (local_38._M_head_impl == (Link *)0x0) {
      next_00._M_head_impl = (Pipeline *)0x0;
    }
    else {
      next_00._M_head_impl =
           *(Pipeline **)
            &((local_38._M_head_impl)->next_pl)._M_t.
             super___uniq_ptr_impl<Pipeline,_std::default_delete<Pipeline>_>._M_t;
    }
    Pipeline::Pipeline((Pipeline *)pCVar4,"",next_00._M_head_impl);
    (pCVar4->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Count_002f6298;
    pCVar4->count = 0;
    pCVar4->str = &peVar2->count_buffer;
    this_00 = &local_38;
    (pCVar4->link)._M_t.super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>.
    _M_t.super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
    super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl = local_38._M_head_impl;
    local_38._M_head_impl = (Link *)0x0;
    pCVar4->id_ = uVar3;
  }
  pCVar4->pass_immediately_to_next = false;
  local_48 = pCVar4;
  std::unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>::~unique_ptr
            ((unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *)this_00);
LAB_001ecf6f:
  peVar2 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pp->stack_id = peVar2->next_stack_id;
  std::vector<Pipeline*,std::allocator<Pipeline*>>::emplace_back<qpdf::pl::Count*&>
            ((vector<Pipeline*,std::allocator<Pipeline*>> *)&peVar2->pipeline_stack,&local_48);
  peVar2 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar2->pipeline = local_48;
  puVar1 = &peVar2->next_stack_id;
  *puVar1 = *puVar1 + 1;
  return;
}

Assistant:

void
QPDFWriter::activatePipelineStack(
    PipelinePopper& pp, bool discard, std::string* str, std::unique_ptr<pl::Link> link)
{
    pl::Count* c;
    if (link) {
        c = new pl::Count(m->next_stack_id, m->count_buffer, std::move(link));
    } else if (discard) {
        c = new pl::Count(m->next_stack_id, nullptr);
    } else if (!str) {
        c = new pl::Count(m->next_stack_id, m->pipeline_stack.back());
    } else {
        c = new pl::Count(m->next_stack_id, *str);
    }
    pp.stack_id = m->next_stack_id;
    m->pipeline_stack.emplace_back(c);
    m->pipeline = c;
    ++m->next_stack_id;
}